

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O2

void boost::detail::test_eq_impl<unsigned_long,int>
               (char *expr1,char *expr2,char *file,int line,char *function,unsigned_long *t,int *u)

{
  ostream *poVar1;
  
  if (*t == (long)*u) {
    report_errors_remind();
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,file);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1,"): test \'");
  poVar1 = std::operator<<(poVar1,expr1);
  poVar1 = std::operator<<(poVar1," == ");
  poVar1 = std::operator<<(poVar1,expr2);
  poVar1 = std::operator<<(poVar1,"\' failed in function \'");
  poVar1 = std::operator<<(poVar1,function);
  poVar1 = std::operator<<(poVar1,"\': ");
  poVar1 = std::operator<<(poVar1,"\'");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\' != \'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*u);
  poVar1 = std::operator<<(poVar1,"\'");
  std::endl<char,std::char_traits<char>>(poVar1);
  report_errors_remind();
  test_errors()::x = test_errors()::x + 1;
  return;
}

Assistant:

inline void test_eq_impl( char const * expr1, char const * expr2,
  char const * file, int line, char const * function, T const & t, U const & u )
{
    if( t == u )
    {
        report_errors_remind();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << t << "' != '" << u << "'" << std::endl;
        ++test_errors();
    }
}